

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

void __thiscall cmProcess::~cmProcess(cmProcess *this)

{
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  std::__cxx11::string::~string((string *)&this->WorkingDirectory);
  std::__cxx11::string::~string((string *)&this->Command);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&this->Output);
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&this->Runner);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->Buf).super__Vector_base<char,_std::allocator<char>_>);
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&this->Timer);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
  ::cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
  return;
}

Assistant:

cmProcess::~cmProcess() = default;